

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DVector3 * __thiscall
AActor::InterpolatedPosition(DVector3 *__return_storage_ptr__,AActor *this,double ticFrac)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (this->__Pos).Z;
  dVar2 = (this->Prev).Z;
  dVar3 = (this->__Pos).Y;
  dVar4 = (this->Prev).X;
  dVar5 = (this->Prev).Y;
  __return_storage_ptr__->X = ticFrac * ((this->__Pos).X - dVar4) + dVar4;
  __return_storage_ptr__->Y = ticFrac * (dVar3 - dVar5) + dVar5;
  __return_storage_ptr__->Z = (dVar1 - dVar2) * ticFrac + dVar2;
  return __return_storage_ptr__;
}

Assistant:

DVector3 InterpolatedPosition(double ticFrac) const
	{
		return Prev + (ticFrac * (Pos() - Prev));
	}